

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::setViewportMargins
          (AbstractScrollArea *this,int left,int top,int right,int bottom)

{
  AbstractScrollAreaPrivate *pAVar1;
  QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
  *this_00;
  QStyleOption local_60 [8];
  QStyleOption opt;
  int bottom_local;
  int right_local;
  int top_local;
  int left_local;
  AbstractScrollArea *this_local;
  
  this_00 = &this->d;
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(this_00);
  pAVar1->left = left;
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(this_00);
  pAVar1->top = top;
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(this_00);
  pAVar1->right = right;
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(this_00);
  pAVar1->bottom = bottom;
  QStyleOption::QStyleOption(local_60,1,0);
  QStyleOption::initFrom((QWidget *)local_60);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::layoutChildren(pAVar1,local_60);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::normalizePosition(pAVar1);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::calcIndicators(pAVar1);
  QWidget::update();
  QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
  ::operator->(&this->d);
  QWidget::update();
  QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
  ::operator->(&this->d);
  QWidget::update();
  QStyleOption::~QStyleOption(local_60);
  return;
}

Assistant:

void
AbstractScrollArea::setViewportMargins( int left, int top,
	int right, int bottom )
{
	d->left = left;
	d->top = top;
	d->right = right;
	d->bottom = bottom;

	QStyleOption opt;
	opt.initFrom( this );
	d->layoutChildren( opt );
	d->normalizePosition();
	d->calcIndicators();

	update();
	d->horIndicator->update();
	d->vertIndicator->update();
}